

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

Symbol * __thiscall
ByteCodeGenerator::FindSymbol
          (ByteCodeGenerator *this,Symbol **symRef,IdentPtr pid,bool forReference)

{
  ParseableFunctionInfo *this_00;
  code *pcVar1;
  Scope *this_01;
  Symbol *pSVar2;
  bool bVar3;
  PropertyId pos;
  undefined4 *puVar4;
  IdentPtr this_02;
  char16 *pcVar5;
  Type *ppFVar6;
  FuncInfo *pFVar7;
  CharacterBuffer<char16_t> *propName;
  PropertyId local_64;
  FuncInfo *pFStack_60;
  PropertyId i;
  Scope *scope;
  Type pFStack_50;
  bool nonLocalRef;
  FuncInfo *top;
  Scope *symScope;
  Symbol *sym;
  char16 *key;
  IdentPtr pIStack_28;
  bool forReference_local;
  IdentPtr pid_local;
  Symbol **symRef_local;
  ByteCodeGenerator *this_local;
  
  sym = (Symbol *)0x0;
  symScope = (Scope *)0x0;
  key._7_1_ = forReference;
  pIStack_28 = pid;
  pid_local = (IdentPtr)symRef;
  symRef_local = (Symbol **)this;
  if (symRef == (Symbol **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x6a0,"(symRef)","symRef");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (pid_local->m_pidNext == (Ident *)0x0) {
    AssignPropertyId(this,pIStack_28);
    this_local = (ByteCodeGenerator *)0x0;
  }
  else {
    symScope = (Scope *)pid_local->m_pidNext;
    this_02 = Symbol::GetPid((Symbol *)symScope);
    sym = (Symbol *)Ident::Psz(this_02);
    top = (FuncInfo *)Symbol::GetScope((Symbol *)symScope);
    if (top == (FuncInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x6ad,"(symScope)","symScope");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar3 = Trace(this);
    pSVar2 = sym;
    if (bVar3) {
      if (symScope == (Scope *)0x0) {
        Output::Print(L"did not resolve %s\n",sym);
      }
      else {
        pcVar5 = Symbol::GetSymbolTypeName((Symbol *)symScope);
        Output::Print(L"resolved %s to symbol of type %s: \n",pSVar2,pcVar5);
      }
    }
    bVar3 = Symbol::GetIsGlobal((Symbol *)symScope);
    if ((!bVar3) && (bVar3 = Symbol::GetIsModuleExportStorage((Symbol *)symScope), !bVar3)) {
      ppFVar6 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Top(this->funcInfoStack);
      pFStack_50 = *ppFVar6;
      pFVar7 = Scope::GetFunc((Scope *)top);
      scope._7_1_ = pFVar7 != pFStack_50;
      pFStack_60 = (FuncInfo *)0x0;
      if (((key._7_1_ & 1) != 0) &&
         ((pFStack_60 = (FuncInfo *)
                        FindScopeForSym(this,(Scope *)top,(Scope *)0x0,&local_64,pFStack_50),
          pFStack_60 != top && (bVar3 = Scope::GetIsDynamic((Scope *)pFStack_60), bVar3)))) {
        scope._7_1_ = 1;
        Symbol::SetHasNonLocalReference((Symbol *)symScope);
        Scope::SetIsObject((Scope *)top);
      }
      if (((scope._7_1_ & 1) != 0) ||
         (bVar3 = Symbol::GetHasNonLocalReference((Symbol *)symScope), bVar3)) {
        ProcessCapturedSym(this,(Symbol *)symScope);
        this_01 = symScope;
        this_00 = pFStack_50->byteCodeFunction;
        propName = Symbol::GetName((Symbol *)symScope);
        pos = Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked(this_00,propName);
        Symbol::SetPosition((Symbol *)this_01,pos);
        ProcessScopeWithCapturedSym(this,(Scope *)top);
        pFVar7 = Scope::GetFunc((Scope *)top);
        bVar3 = FuncInfo::GetHasArguments(pFVar7);
        if ((bVar3) && (bVar3 = Symbol::GetIsFormal((Symbol *)symScope), bVar3)) {
          pFVar7 = Scope::GetFunc((Scope *)top);
          FuncInfo::SetHasHeapArguments(pFVar7,true,false);
        }
        pFVar7 = Scope::GetFunc((Scope *)top);
        if (pFVar7 != pFStack_50) {
          FuncInfo::SetHasClosureReference(pFStack_50,true);
        }
      }
      else if (((((scope._7_1_ & 1) == 0) &&
                (bVar3 = Symbol::GetHasNonLocalReference((Symbol *)symScope), bVar3)) &&
               (bVar3 = Symbol::GetIsCommittedToSlot((Symbol *)symScope), !bVar3)) &&
              (bVar3 = Symbol::HasVisitedCapturingFunc((Symbol *)symScope), !bVar3)) {
        Symbol::SetHasNonCommittedReference((Symbol *)symScope,true);
      }
      bVar3 = Symbol::GetIsFuncExpr((Symbol *)symScope);
      if (bVar3) {
        pFVar7 = Scope::GetFunc((Scope *)top);
        FuncInfo::SetFuncExprNameReference(pFVar7,true);
      }
    }
    this_local = (ByteCodeGenerator *)symScope;
  }
  return (Symbol *)this_local;
}

Assistant:

Symbol * ByteCodeGenerator::FindSymbol(Symbol **symRef, IdentPtr pid, bool forReference)
{
    const char16 *key = nullptr;

    Symbol *sym = nullptr;
    Assert(symRef);
    if (*symRef)
    {
        sym = *symRef;
    }
    else
    {
        this->AssignPropertyId(pid);
        return nullptr;
    }
    key = reinterpret_cast<const char16*>(sym->GetPid()->Psz());

    Scope *symScope = sym->GetScope();
    Assert(symScope);

#if DBG_DUMP
    if (this->Trace())
    {
        if (sym != nullptr)
        {
            Output::Print(_u("resolved %s to symbol of type %s: \n"), key, sym->GetSymbolTypeName());
        }
        else
        {
            Output::Print(_u("did not resolve %s\n"), key);
        }
    }
#endif

    if (!sym->GetIsGlobal() && !sym->GetIsModuleExportStorage())
    {
        FuncInfo *top = funcInfoStack->Top();

        bool nonLocalRef = symScope->GetFunc() != top;
        Scope *scope = nullptr;
        if (forReference)
        {
            Js::PropertyId i;
            scope = FindScopeForSym(symScope, nullptr, &i, top);
            // If we have a reference to a local within a with, we want to generate a closure represented by an object.
            if (scope != symScope && scope->GetIsDynamic())
            {
                nonLocalRef = true;
                sym->SetHasNonLocalReference();
                symScope->SetIsObject();
            }
        }

        // This may not be a non-local reference, but the symbol may still be accessed non-locally. ('with', e.g.)
        // In that case, make sure we still process the symbol and its scope for closure capture.
        if (nonLocalRef || sym->GetHasNonLocalReference())
        {
            // Symbol referenced through a closure. Mark it as such and give it a property ID.
            this->ProcessCapturedSym(sym);
            sym->SetPosition(top->byteCodeFunction->GetOrAddPropertyIdTracked(sym->GetName()));
            // If this is var is local to a function (meaning that it belongs to the function's scope
            // *or* to scope that need not be instantiated, like a function expression scope, which we'll
            // merge with the function scope, then indicate that fact.
            this->ProcessScopeWithCapturedSym(symScope);
            if (symScope->GetFunc()->GetHasArguments() && sym->GetIsFormal())
            {
                // A formal is referenced non-locally. We need to allocate it on the heap, so
                // do the same for the whole arguments object.

                // Formal is referenced. So count of formals to function > 0.
                // So no need to check for inParams here.

                symScope->GetFunc()->SetHasHeapArguments(true);
            }
            if (symScope->GetFunc() != top)
            {
                top->SetHasClosureReference(true);
            }
        }
        else if (!nonLocalRef && sym->GetHasNonLocalReference() && !sym->GetIsCommittedToSlot() && !sym->HasVisitedCapturingFunc())
        {
            sym->SetHasNonCommittedReference(true);
        }

        if (sym->GetIsFuncExpr())
        {
            symScope->GetFunc()->SetFuncExprNameReference(true);
        }
    }

    return sym;
}